

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

char * ecs_get_name(ecs_world_t *world,ecs_entity_t entity)

{
  undefined8 *puVar1;
  char *pcVar2;
  
  if (entity == 0x11a) {
    return "$";
  }
  puVar1 = (undefined8 *)ecs_get_w_entity(world,entity,6);
  if (puVar1 == (undefined8 *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = (char *)*puVar1;
  }
  return pcVar2;
}

Assistant:

const char* ecs_get_name(
    ecs_world_t *world,
    ecs_entity_t entity)
{
    if (entity == EcsSingleton) {
        return "$";
    }

    const EcsName *id = ecs_get(world, entity, EcsName);

    if (id) {
        return id->value;
    } else {
        return NULL;
    }
}